

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O0

HighsInt highs_splay<int,HighsGFkSolve::unlink(int)::__0&,HighsGFkSolve::unlink(int)::__1&,HighsGFkSolve::unlink(int)::__2&>
                   (int *key,HighsInt root,anon_class_8_1_8991fb9c *get_left,
                   anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  int iVar1;
  HighsInt HVar2;
  value_type vVar3;
  HighsInt *pHVar4;
  int in_ESI;
  int *in_RDI;
  HighsInt y_1;
  HighsInt right;
  HighsInt y;
  HighsInt left;
  HighsInt *rleft;
  HighsInt *lright;
  HighsInt Nright;
  HighsInt Nleft;
  HighsInt in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  undefined4 in_stack_ffffffffffffff84;
  int *local_48;
  int *local_40;
  int local_38;
  int local_34 [8];
  int local_14;
  int *local_10;
  int local_4;
  
  if (in_ESI == -1) {
    local_4 = -1;
  }
  else {
    local_34[0] = -1;
    local_38 = -1;
    local_40 = &local_38;
    local_48 = local_34;
    local_14 = in_ESI;
    local_10 = in_RDI;
    while( true ) {
      while (iVar5 = *local_10,
            vVar3 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff7c), iVar5 < vVar3) {
        pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        iVar5 = *pHVar4;
        if (iVar5 == -1) goto LAB_005e9f0b;
        iVar1 = *local_10;
        vVar3 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c);
        if (iVar1 < vVar3) {
          pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                             ((anon_class_8_1_8991fb9c *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c);
          HVar2 = *pHVar4;
          pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                             ((anon_class_8_1_8991fb9c *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c);
          iVar1 = local_14;
          *pHVar4 = HVar2;
          pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                             ((anon_class_8_1_8991fb9c *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c);
          *pHVar4 = iVar1;
          local_14 = iVar5;
          pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                             ((anon_class_8_1_8991fb9c *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c);
          if (*pHVar4 == -1) goto LAB_005e9f0b;
        }
        *local_48 = local_14;
        local_48 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                             ((anon_class_8_1_8991fb9c *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c);
        pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        local_14 = *pHVar4;
      }
      iVar5 = *local_10;
      vVar3 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c);
      if (iVar5 <= vVar3) break;
      pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c);
      iVar5 = *pHVar4;
      if (iVar5 == -1) break;
      iVar1 = *local_10;
      vVar3 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c);
      if (vVar3 < iVar1) {
        pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        HVar2 = *pHVar4;
        pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        iVar1 = local_14;
        *pHVar4 = HVar2;
        pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        *pHVar4 = iVar1;
        local_14 = iVar5;
        pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
        if (*pHVar4 == -1) break;
      }
      *local_40 = local_14;
      local_40 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff7c);
      pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c);
      local_14 = *pHVar4;
    }
LAB_005e9f0b:
    pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
    *local_40 = *pHVar4;
    pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
    *local_48 = *pHVar4;
    iVar5 = local_38;
    pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)CONCAT44(in_stack_ffffffffffffff84,local_38),
                        in_stack_ffffffffffffff7c);
    *pHVar4 = iVar5;
    pHVar4 = HighsGFkSolve::unlink::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)CONCAT44(local_34[0],iVar5),
                        in_stack_ffffffffffffff7c);
    *pHVar4 = local_34[0];
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

HighsInt highs_splay(const KeyT& key, HighsInt root, GetLeft&& get_left,
                     GetRight&& get_right, GetKey&& get_key) {
  if (root == -1) return -1;

  HighsInt Nleft = -1;
  HighsInt Nright = -1;
  HighsInt* lright = &Nright;
  HighsInt* rleft = &Nleft;

  while (true) {
    if (key < get_key(root)) {
      HighsInt left = get_left(root);
      if (left == -1) break;
      if (key < get_key(left)) {
        HighsInt y = left;
        get_left(root) = get_right(y);
        get_right(y) = root;
        root = y;
        if (get_left(root) == -1) break;
      }

      *rleft = root;
      rleft = &get_left(root);
      root = get_left(root);
    } else if (key > get_key(root)) {
      HighsInt right = get_right(root);
      if (right == -1) break;
      if (key > get_key(right)) {
        HighsInt y = right;
        get_right(root) = get_left(y);
        get_left(y) = root;
        root = y;
        if (get_right(root) == -1) break;
      }

      *lright = root;
      lright = &get_right(root);
      root = get_right(root);
    } else
      break;
  }

  *lright = get_left(root);
  *rleft = get_right(root);
  get_left(root) = Nright;
  get_right(root) = Nleft;

  return root;
}